

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O1

bool __thiscall
jsoncons::basic_item_event_visitor<char>::visit_typed_array
          (basic_item_event_visitor<char> *this,span<const_unsigned_int,_18446744073709551615UL> *s,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  int iVar1;
  undefined7 in_register_00000011;
  uint *puVar2;
  bool bVar3;
  
  (*this->_vptr_basic_item_event_visitor[7])(this,s->size_,CONCAT71(in_register_00000011,tag));
  if (ec->_M_value == 0) {
    bVar3 = s->size_ == 0;
    if (!bVar3) {
      puVar2 = s->data_;
      (*this->_vptr_basic_item_event_visitor[0xe])(this,(ulong)*puVar2,0,context,ec);
      iVar1 = ec->_M_value;
      while (iVar1 == 0) {
        puVar2 = puVar2 + 1;
        bVar3 = puVar2 == s->data_ + s->size_;
        if (bVar3) goto LAB_001632f1;
        (*this->_vptr_basic_item_event_visitor[0xe])(this,(ulong)*puVar2,0,context,ec);
        iVar1 = ec->_M_value;
      }
      if (!bVar3) {
        return true;
      }
    }
LAB_001632f1:
    (*this->_vptr_basic_item_event_visitor[8])(this,context,ec);
  }
  return true;
}

Assistant:

virtual JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const uint32_t>& s, 
            semantic_tag tag,
            const ser_context& context, 
            std::error_code& ec) 
        {
            begin_array(s.size(), tag, context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            for (auto p = s.begin(); p != s.end(); ++p)
            {
                uint64_value(*p, semantic_tag::none, context, ec);
                if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            }
            end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }